

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

uint * __thiscall
kj::_::NullableValue<unsigned_int>::emplace<kj::(anonymous_namespace)::ImplicitToInt>
          (NullableValue<unsigned_int> *this,ImplicitToInt *params)

{
  ImplicitToInt *params_00;
  ImplicitToInt *params_local;
  NullableValue<unsigned_int> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<unsigned_int>(&(this->field_1).value);
  }
  params_00 = fwd<kj::(anonymous_namespace)::ImplicitToInt>(params);
  ctor<unsigned_int,kj::(anonymous_namespace)::ImplicitToInt>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (uint *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }